

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

bool chaiscript::AST_Node::get_bool_condition(Boxed_Value *t_bv,Dispatch_State *t_ss)

{
  bool bVar1;
  Type_Conversions *this;
  Type_Conversions_State local_28;
  
  this = &((t_ss->m_engine)._M_data)->m_conversions;
  local_28.m_saves._M_data = Type_Conversions::conversion_saves(this);
  local_28.m_conversions._M_data = this;
  bVar1 = boxed_cast<bool>(t_bv,&local_28);
  return bVar1;
}

Assistant:

bool AST_Node::get_bool_condition(const Boxed_Value &t_bv, const chaiscript::detail::Dispatch_State &t_ss) {
      try {
        return t_ss->boxed_cast<bool>(t_bv);
      } catch (const exception::bad_boxed_cast &) {
        throw exception::eval_error("Condition not boolean");
      }
  }